

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

string * uriDecode_abi_cxx11_(string_view str)

{
  char *pcVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint spchar;
  char *loc;
  array<char,_3UL> exp;
  size_t ii;
  string *ret;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *local_40;
  value_type local_37;
  value_type local_36;
  undefined1 local_35;
  ulong local_28;
  undefined1 local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_19 = 0;
  this = in_RDI;
  std::__cxx11::string::string(in_RDI);
  local_28 = 0;
  while (uVar5 = local_28,
        sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
        uVar5 < sVar2) {
    pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&local_18,local_28);
    if (*pvVar3 == '%') {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,local_28 + 1);
      local_37 = *pvVar3;
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,local_28 + 2);
      local_36 = *pvVar3;
      local_35 = 0;
      local_40 = (char *)0x0;
      pvVar4 = CLI::std::array<char,_3UL>::data((array<char,_3UL> *)0x21d985);
      strtoul(pvVar4,&local_40,0x10);
      pcVar1 = local_40;
      pvVar4 = CLI::std::array<char,_3UL>::data((array<char,_3UL> *)0x21d9ae);
      if ((long)pcVar1 - (long)pvVar4 < 2) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_28);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
        local_28 = local_28 + 2;
      }
    }
    else {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,local_28);
      if (*pvVar3 == '+') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
      }
      else {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_28);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
      }
    }
    local_28 = local_28 + 1;
  }
  return this;
}

Assistant:

static std::string uriDecode(const std::string_view str)
{
    std::string ret;

    for (size_t ii = 0; ii < str.length(); ii++) {
        if (str[ii] != '%') {
            if (str[ii] == '+') {
                ret.push_back(' ');
            } else {
                ret.push_back(str[ii]);
            }
        } else {
            const std::array<char, 3> exp{{str[ii + 1], str[ii + 2], '\0'}};
            char* loc{nullptr};
            const unsigned int spchar = strtoul(exp.data(), &loc, 16);
            if (loc - exp.data() >= 2) {
                ret.push_back(static_cast<char>(spchar));
                ii = ii + 2;
            } else {
                ret.push_back(str[ii]);
            }
        }
    }
    return ret;
}